

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O3

void __thiscall
amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::AllocateBuffer
          (PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *this,size_type a_capacity)

{
  BCRec *__dest;
  pointer pBVar1;
  
  __dest = __gnu_cxx::new_allocator<amrex::BCRec>::allocate
                     ((new_allocator<amrex::BCRec> *)this,a_capacity,(void *)0x0);
  if (this->m_data == (pointer)0x0) {
    pBVar1 = (pointer)0x0;
  }
  else {
    memcpy(__dest,this->m_data,this->m_size * 0x18);
    Gpu::Device::streamSynchronize();
    pBVar1 = this->m_data;
  }
  operator_delete(pBVar1,this->m_capacity * 0x18);
  this->m_data = __dest;
  this->m_capacity = a_capacity;
  return;
}

Assistant:

void AllocateBuffer (size_type a_capacity) noexcept
        {
            pointer new_data = allocate(a_capacity);
            if (m_data) {
                detail::memCopyImpl<Allocator>(new_data, m_data, size() * sizeof(T), *this);
                amrex::Gpu::streamSynchronize();
            }
            deallocate(m_data, capacity());
            m_data = new_data;
            m_capacity = a_capacity;
        }